

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

int __thiscall
boost::runtime::parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true>::
clone(parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true> *this,
     __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true> *this_00;
  
  this_00 = (parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true> *)
            operator_new(0x120);
  parameter(this_00,(parameter<boost::unit_test::report_level,_(boost::runtime::args_amount)0,_true>
                     *)__fn);
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::parameter<boost::unit_test::report_level,(boost::runtime::args_amount)0,true>>
            ((shared_ptr<boost::runtime::basic_param> *)this,this_00);
  return (int)this;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new parameter( *this ) );
    }